

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptPromise.cpp
# Opt level: O2

Var Js::JavascriptPromise::EntryThenFinallyFunction
              (RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *pSVar1;
  JavascriptLibrary *this;
  ThreadContext *pTVar2;
  code *pcVar3;
  bool bVar4;
  undefined4 *puVar5;
  JavascriptPromiseThenFinallyFunction *pJVar6;
  JavascriptMethod p_Var7;
  Var pvVar8;
  RecyclableObject *pRVar9;
  JavascriptPromiseThunkFinallyFunction *pJVar10;
  Var aValue;
  int in_stack_00000010;
  undefined1 local_50 [8];
  ArgumentReader args;
  CallInfo callInfo_local;
  
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  args.super_Arguments.Values = (Type)callInfo;
  ThreadContext::ProbeStack(pSVar1->threadContext,0xc00,pSVar1,(PVOID)0x0);
  if (callInfo._0_4_ != in_stack_00000010) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptPromise.cpp"
                                ,0x3d8,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar4) goto LAB_00b9d7dd;
    *puVar5 = 0;
  }
  ArgumentReader::ArgumentReader
            ((ArgumentReader *)local_50,(CallInfo *)&args.super_Arguments.Values,
             (Var *)&stack0x00000018);
  if (((ulong)args.super_Arguments.Values & 0x1000000) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptPromise.cpp"
                                ,0x3d9,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar4) goto LAB_00b9d7dd;
    *puVar5 = 0;
  }
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  this = (pSVar1->super_ScriptContextBase).javascriptLibrary;
  pJVar6 = VarTo<Js::JavascriptPromiseThenFinallyFunction,Js::RecyclableObject>(function);
  bVar4 = JavascriptConversion::IsCallable((pJVar6->OnFinally).ptr);
  if (!bVar4) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptPromise.cpp"
                                ,0x3e2,
                                "(JavascriptConversion::IsCallable(thenFinallyFunction->GetOnFinally()))"
                                ,
                                "JavascriptConversion::IsCallable(thenFinallyFunction->GetOnFinally())"
                               );
    if (!bVar4) goto LAB_00b9d7dd;
    *puVar5 = 0;
  }
  pTVar2 = pSVar1->threadContext;
  bVar4 = pTVar2->reentrancySafeOrHandled;
  pTVar2->reentrancySafeOrHandled = true;
  ThreadContext::CheckAndResetReentrancySafeOrHandled(pTVar2);
  ThreadContext::AssertJsReentrancy(pSVar1->threadContext);
  pRVar9 = (pJVar6->OnFinally).ptr;
  p_Var7 = RecyclableObject::GetEntryPoint(pRVar9);
  CheckIsExecutable(pRVar9,p_Var7);
  p_Var7 = RecyclableObject::GetEntryPoint((pJVar6->OnFinally).ptr);
  pRVar9 = (pJVar6->OnFinally).ptr;
  pvVar8 = (*p_Var7)(pRVar9,(CallInfo)pRVar9,0x2000001,0,0,0,0,0x2000001,
                     (this->super_JavascriptLibraryBase).undefinedValue.ptr);
  pTVar2->reentrancySafeOrHandled = bVar4;
  if (pvVar8 == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptPromise.cpp"
                                ,0x3ed,"(result)","result");
    if (!bVar4) goto LAB_00b9d7dd;
    *puVar5 = 0;
  }
  bVar4 = JavascriptOperators::IsConstructor((pJVar6->Constructor).ptr);
  if (!bVar4) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptPromise.cpp"
                                ,0x3f1,
                                "(JavascriptOperators::IsConstructor(thenFinallyFunction->GetConstructor()))"
                                ,
                                "JavascriptOperators::IsConstructor(thenFinallyFunction->GetConstructor())"
                               );
    if (!bVar4) {
LAB_00b9d7dd:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar5 = 0;
  }
  pvVar8 = CreateResolvedPromise(pvVar8,pSVar1,(pJVar6->Constructor).ptr);
  if ((local_50._0_4_ & 0xfffffe) == 0) {
    pRVar9 = (((pSVar1->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
             undefinedValue.ptr;
  }
  else {
    pRVar9 = (RecyclableObject *)Arguments::operator[]((Arguments *)local_50,1);
  }
  pJVar10 = JavascriptLibrary::CreatePromiseThunkFinallyFunction
                      (this,EntryThunkFinallyFunction,pRVar9,pJVar6->shouldThrow);
  pRVar9 = JavascriptOperators::ToObject(pvVar8,pSVar1);
  aValue = JavascriptOperators::GetProperty(pRVar9,0x169,pSVar1,(PropertyValueInfo *)0x0);
  bVar4 = JavascriptConversion::IsCallable(aValue);
  if (bVar4) {
    pRVar9 = VarTo<Js::RecyclableObject>(aValue);
    pTVar2 = pSVar1->threadContext;
    bVar4 = pTVar2->reentrancySafeOrHandled;
    pTVar2->reentrancySafeOrHandled = true;
    ThreadContext::CheckAndResetReentrancySafeOrHandled(pTVar2);
    ThreadContext::AssertJsReentrancy(pSVar1->threadContext);
    p_Var7 = RecyclableObject::GetEntryPoint(pRVar9);
    CheckIsExecutable(pRVar9,p_Var7);
    p_Var7 = RecyclableObject::GetEntryPoint(pRVar9);
    pvVar8 = (*p_Var7)(pRVar9,(CallInfo)pRVar9,0x2000002,0,0,0,0,0x2000002,pvVar8,pJVar10);
    pTVar2->reentrancySafeOrHandled = bVar4;
    return pvVar8;
  }
  JavascriptError::ThrowTypeError(pSVar1,-0x7ff5ec34,L"Promise.prototype.finally");
}

Assistant:

Var JavascriptPromise::EntryThenFinallyFunction(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);
        ARGUMENTS(args, callInfo);
        Assert(!(callInfo.Flags & CallFlags_New));
        ScriptContext* scriptContext = function->GetScriptContext();

        JavascriptLibrary* library = scriptContext->GetLibrary();

        JavascriptPromiseThenFinallyFunction* thenFinallyFunction = VarTo<JavascriptPromiseThenFinallyFunction>(function);

        // 1. Let onFinally be F.[[OnFinally]]
        // 2. Assert: IsCallable(onFinally)=true
        Assert(JavascriptConversion::IsCallable(thenFinallyFunction->GetOnFinally()));

        // 3. Let result be ? Call(onFinally, undefined)
        Var result = nullptr;

        BEGIN_SAFE_REENTRANT_CALL(scriptContext->GetThreadContext())
        {
            result = CALL_FUNCTION(scriptContext->GetThreadContext(), thenFinallyFunction->GetOnFinally(), CallInfo(CallFlags_Value, 1), library->GetUndefined());
        }
        END_SAFE_REENTRANT_CALL

        Assert(result);

        // 4. Let C be F.[[Constructor]]
        // 5. Assert IsConstructor(C)
        Assert(JavascriptOperators::IsConstructor(thenFinallyFunction->GetConstructor()));

        // 6. Let promise be ? PromiseResolve(c, result)
        Var promiseVar = CreateResolvedPromise(result, scriptContext, thenFinallyFunction->GetConstructor());

        // 7. Let valueThunk be equivalent to a function that returns value
        // OR 7. Let thrower be equivalent to a function that throws reason

        Var valueOrReason = nullptr;

        if (args.Info.Count > 1)
        {
            valueOrReason = args[1];
        }
        else
        {
            valueOrReason = scriptContext->GetLibrary()->GetUndefined();
        }

        JavascriptPromiseThunkFinallyFunction* thunkFinallyFunction = library->CreatePromiseThunkFinallyFunction(EntryThunkFinallyFunction, valueOrReason, thenFinallyFunction->GetShouldThrow());

        // 8. Return ? Invoke(promise, "then", <<valueThunk>>)
        RecyclableObject* promise = JavascriptOperators::ToObject(promiseVar, scriptContext);
        Var funcVar = JavascriptOperators::GetProperty(promise, Js::PropertyIds::then, scriptContext);

        if (!JavascriptConversion::IsCallable(funcVar))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_FunctionArgument_NeedFunction, _u("Promise.prototype.finally"));
        }

        RecyclableObject* func = VarTo<RecyclableObject>(funcVar);

        BEGIN_SAFE_REENTRANT_CALL(scriptContext->GetThreadContext())
        {
            return CALL_FUNCTION(scriptContext->GetThreadContext(),
                func, Js::CallInfo(CallFlags_Value, 2),
                promiseVar,
                thunkFinallyFunction);
        }
        END_SAFE_REENTRANT_CALL
    }